

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2_kmeth.c
# Opt level: O0

int SM2_compute_pubkey_bn(BIGNUM *privkey_bn,BIGNUM *pubkey_x_bn,BIGNUM *pubkey_y_bn)

{
  int iVar1;
  EC_GROUP *group_00;
  BIGNUM *in_RDX;
  BIGNUM *in_RSI;
  BIGNUM *in_RDI;
  EC_GROUP *group;
  EC_POINT *point;
  BN_CTX *ctx;
  int ret;
  EC_POINT *local_30;
  BN_CTX *local_28;
  int local_1c;
  
  local_1c = 0;
  local_28 = (BN_CTX *)0x0;
  local_30 = (EC_POINT *)0x0;
  group_00 = SM2_get_group();
  if ((((group_00 != (EC_GROUP *)0x0) && (in_RDI != (BIGNUM *)0x0)) && (in_RSI != (BIGNUM *)0x0)) &&
     (in_RDX != (BIGNUM *)0x0)) {
    local_28 = BN_CTX_new();
    local_30 = EC_POINT_new((EC_GROUP *)group_00);
    if (((local_30 != (EC_POINT *)0x0) && (local_28 != (BN_CTX *)0x0)) &&
       ((iVar1 = EC_POINT_mul((EC_GROUP *)group_00,local_30,in_RDI,(EC_POINT *)0x0,(BIGNUM *)0x0,
                              local_28), iVar1 != 0 &&
        (iVar1 = EC_POINT_get_affine_coordinates_GFp
                           ((EC_GROUP *)group_00,local_30,in_RSI,in_RDX,local_28), iVar1 != 0)))) {
      local_1c = 1;
    }
  }
  BN_CTX_free(local_28);
  EC_POINT_free(local_30);
  return local_1c;
}

Assistant:

int SM2_compute_pubkey_bn(BIGNUM *privkey_bn, BIGNUM *pubkey_x_bn, BIGNUM *pubkey_y_bn)
{
    int ret = GML_ERROR;
    BN_CTX *ctx = NULL;
    EC_POINT *point = NULL;
    const EC_GROUP *group = NULL;

    group = SM2_get_group();
    if (group == NULL || privkey_bn == NULL || pubkey_x_bn == NULL || pubkey_y_bn == NULL)
        goto end;

    ctx = BN_CTX_new();
    point = EC_POINT_new(group);
    if (point == NULL || ctx == NULL)
        goto end;

    /* compute public key : point = k * G */
    if (EC_POINT_mul(group, point, privkey_bn, NULL, NULL, ctx) == GML_ERROR) 
        goto end;

    if (EC_POINT_get_affine_coordinates_GFp(group, point, pubkey_x_bn, pubkey_y_bn, ctx) == GML_ERROR) 
        goto end;

    ret = GML_OK;
end:
    BN_CTX_free(ctx);
    EC_POINT_free(point);
    return ret;
}